

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# token_evaluator.hpp
# Opt level: O1

void __thiscall
jsoncons::jsonpath::detail::
token<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>,_const_jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
::destroy(token<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>,_const_jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
          *this)

{
  if (this->token_kind_ == literal) {
    basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>::destroy
              (&(this->field_1).value_);
  }
  else if (this->token_kind_ == expression) {
    if ((this->field_1).selector_ != (selector_type *)0x0) {
      (*((this->field_1).selector_)->_vptr_jsonpath_selector[1])();
    }
    (this->field_1).selector_ = (selector_type *)0x0;
  }
  return;
}

Assistant:

void destroy() noexcept 
        {
            switch(token_kind_)
            {
                case jsonpath_token_kind::expression:
                    expression_.~unique_ptr();
                    break;
                case jsonpath_token_kind::literal:
                    value_.~Json();
                    break;
                default:
                    break;
            }
        }